

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertex_with_texture.c
# Opt level: O0

void prf_vertex_with_texture_fill_vertex(prf_node_t *node,prf_vertex_t *vertex)

{
  undefined8 *puVar1;
  bool bVar2;
  undefined8 *in_RSI;
  ushort *in_RDI;
  node_data_conflict16 *data;
  bool_t complete;
  int pos;
  uint local_14;
  
  local_14 = 4;
  bVar2 = false;
  if (*in_RDI == prf_vertex_with_texture_info.opcode) {
    puVar1 = *(undefined8 **)(in_RDI + 4);
    if (5 < in_RDI[1]) {
      *(undefined2 *)(in_RSI + 3) = *(undefined2 *)(puVar1 + 3);
      local_14 = 6;
      if (7 < in_RDI[1]) {
        *(undefined2 *)((long)in_RSI + 0x1a) = *(undefined2 *)((long)puVar1 + 0x1a);
        local_14 = 8;
        if (0xf < in_RDI[1]) {
          *in_RSI = *puVar1;
          local_14 = 0x10;
          if (0x17 < in_RDI[1]) {
            in_RSI[1] = puVar1[1];
            local_14 = 0x18;
            if (0x1f < in_RDI[1]) {
              in_RSI[2] = puVar1[2];
              local_14 = 0x20;
              if (0x23 < in_RDI[1]) {
                *(undefined4 *)(in_RSI + 5) = *(undefined4 *)((long)puVar1 + 0x1c);
                local_14 = 0x24;
                if (0x27 < in_RDI[1]) {
                  *(undefined4 *)((long)in_RSI + 0x2c) = *(undefined4 *)(puVar1 + 4);
                  local_14 = 0x28;
                  *(undefined4 *)((long)in_RSI + 0x3c) = 1;
                  if (0x2b < in_RDI[1]) {
                    *(undefined4 *)(in_RSI + 6) = *(undefined4 *)((long)puVar1 + 0x24);
                    local_14 = 0x2c;
                    bVar2 = true;
                    if (0x2f < in_RDI[1]) {
                      *(undefined4 *)((long)in_RSI + 0x34) = *(undefined4 *)(puVar1 + 5);
                      local_14 = 0x30;
                      bVar2 = true;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    if (!bVar2) {
      prf_warn(1,"stores only %d bytes in vertex with texture",(ulong)local_14);
    }
    if (local_14 < in_RDI[1]) {
      prf_warn(1,"vertex with texture is larger than %d bytes (%d)",(ulong)local_14,(ulong)in_RDI[1]
              );
    }
  }
  else {
    prf_error(9,"vertex with texture: fill from node of type %d.",(ulong)*in_RDI);
  }
  return;
}

Assistant:

void
prf_vertex_with_texture_fill_vertex(
    prf_node_t * node,
    prf_vertex_t * vertex )
{
    int pos = 4;
    bool_t complete = FALSE;

    assert( node != NULL && vertex != NULL );

    if ( node->opcode != prf_vertex_with_texture_info.opcode ) {
        prf_error( 9, "vertex with texture: fill from node of type %d.",
            node->opcode );
        return;
    }

    do {
        node_data * data = (node_data *) node->data;
        if ( node->length < (pos + 2) ) break;
        vertex->color_name_index = data->color_name_index; pos += 2;
        if ( node->length < (pos + 2) ) break;
        vertex->flags = data->flags; pos += 2;
        if ( node->length < (pos + 8) ) break;
        prf_dblcpy( vertex->x, data->x ); pos += 8;
        if ( node->length < (pos + 8) ) break;
        prf_dblcpy( vertex->y, data->y ); pos += 8;
        if ( node->length < (pos + 8) ) break;
        prf_dblcpy( vertex->z, data->z ); pos += 8;
        if ( node->length < (pos + 4) ) break;
        vertex->texture[0] = data->texture[0]; pos += 4;
        if ( node->length < (pos + 4) ) break;
        vertex->texture[1] = data->texture[1]; pos += 4;
        vertex->has_texture = TRUE;
        if ( node->length < (pos + 4) ) break;
        vertex->packed_color = data->packed_color; pos += 4;
        complete = TRUE;
        if ( node->length < (pos + 4) ) break;
        vertex->color_index = data->color_index; pos += 4;
        complete = TRUE;
    } while ( FALSE );

    if ( ! complete )
        prf_warn( 1, "stores only %d bytes in vertex with texture", pos );
    /* padding can't be dealt with, but should be notified, though  */
    if ( pos < node->length )
        prf_warn( 1, "vertex with texture is larger than %d bytes (%d)",
            pos, node->length );

}